

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ReadReference
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *this)

{
  char cVar1;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *in_RDI;
  TextReader<fmt::Locale> *in_stack_00000008;
  CStringRef in_stack_00000010;
  BasicCStringRef<char> local_10 [2];
  
  cVar1 = ReaderBase::ReadChar(&in_RDI->reader_->super_ReaderBase);
  if (cVar1 != 'v') {
    fmt::BasicCStringRef<char>::BasicCStringRef(local_10,"expected reference");
    TextReader<fmt::Locale>::ReportError<>(in_stack_00000008,in_stack_00000010);
  }
  DoReadReference(in_RDI);
  return;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }